

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

size_t xmlBufNodeDump(xmlBufPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format)

{
  xmlOutputBufferPtr buf_00;
  size_t sVar1;
  size_t sVar2;
  
  xmlInitParser();
  sVar2 = 0xffffffffffffffff;
  if (buf != (xmlBufPtr)0x0 && cur != (xmlNodePtr)0x0) {
    buf_00 = (xmlOutputBufferPtr)(*xmlMalloc)(0x38);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,7,
                          (xmlError *)0x0);
    }
    else {
      buf_00->buffer = (xmlBufPtr)0x0;
      buf_00->conv = (xmlBufPtr)0x0;
      buf_00->closecallback = (xmlOutputCloseCallback)0x0;
      buf_00->encoder = (xmlCharEncodingHandlerPtr)0x0;
      buf_00->context = (void *)0x0;
      buf_00->writecallback = (xmlOutputWriteCallback)0x0;
      buf_00->written = 0;
      buf_00->error = 0;
      buf_00->buffer = buf;
      buf_00->written = 0;
      sVar1 = xmlBufUse(buf);
      xmlNodeDumpOutput(buf_00,doc,cur,level,format,(char *)0x0);
      sVar2 = 0xffffffffffffffff;
      if (buf_00->error == 0) {
        sVar2 = xmlBufUse(buf);
        sVar2 = sVar2 - sVar1;
      }
      (*xmlFree)(buf_00);
    }
  }
  return sVar2;
}

Assistant:

size_t
xmlBufNodeDump(xmlBufPtr buf, xmlDocPtr doc, xmlNodePtr cur, int level,
            int format)
{
    size_t use;
    size_t ret;
    xmlOutputBufferPtr outbuf;

    xmlInitParser();

    if (cur == NULL) {
        return ((size_t) -1);
    }
    if (buf == NULL) {
        return ((size_t) -1);
    }
    outbuf = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (outbuf == NULL) {
        xmlSaveErrMemory(NULL);
        return ((size_t) -1);
    }
    memset(outbuf, 0, (size_t) sizeof(xmlOutputBuffer));
    outbuf->buffer = buf;
    outbuf->encoder = NULL;
    outbuf->writecallback = NULL;
    outbuf->closecallback = NULL;
    outbuf->context = NULL;
    outbuf->written = 0;

    use = xmlBufUse(buf);
    xmlNodeDumpOutput(outbuf, doc, cur, level, format, NULL);
    if (outbuf->error)
        ret = (size_t) -1;
    else
        ret = xmlBufUse(buf) - use;
    xmlFree(outbuf);
    return (ret);
}